

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2UDiv<unsigned_int>
          (OptimizeInstructions *this,Binary *binary,uint c)

{
  Const *pCVar1;
  Literal local_38;
  uint32_t local_20;
  uint local_1c;
  int shifts;
  uint c_local;
  Binary *binary_local;
  OptimizeInstructions *this_local;
  
  local_1c = c;
  _shifts = binary;
  binary_local = (Binary *)this;
  local_20 = Bits::countTrailingZeroes(c);
  _shifts->op = ShrUInt32;
  wasm::Literal::Literal(&local_38,local_20);
  pCVar1 = Expression::cast<wasm::Const>(_shifts->right);
  wasm::Literal::operator=(&pCVar1->value,&local_38);
  wasm::Literal::~Literal(&local_38);
  return (Expression *)_shifts;
}

Assistant:

Expression* optimizePowerOf2UDiv(Binary* binary, T c) {
    static_assert(std::is_same<T, uint32_t>::value ||
                    std::is_same<T, uint64_t>::value,
                  "type mismatch");
    auto shifts = Bits::countTrailingZeroes(c);
    binary->op = std::is_same<T, uint32_t>::value ? ShrUInt32 : ShrUInt64;
    binary->right->cast<Const>()->value = Literal(static_cast<T>(shifts));
    return binary;
  }